

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

TString * glslang::getNameForIdMap_abi_cxx11_(TIntermSymbol *symbol)

{
  int iVar1;
  TShaderInterface TVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TShaderInterface si;
  TIntermSymbol *symbol_local;
  
  iVar1 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  TVar2 = TType::getShaderInterface((TType *)CONCAT44(extraout_var,iVar1));
  if (TVar2 == EsiNone) {
    iVar1 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    symbol_local = (TIntermSymbol *)CONCAT44(extraout_var_00,iVar1);
  }
  else {
    iVar1 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    symbol_local = (TIntermSymbol *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x28))()
    ;
  }
  return (TString *)symbol_local;
}

Assistant:

static const TString& getNameForIdMap(TIntermSymbol* symbol)
{
    TShaderInterface si = symbol->getType().getShaderInterface();
    if (si == EsiNone)
        return symbol->getName();
    else
        return symbol->getType().getTypeName();
}